

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.cpp
# Opt level: O1

void fe::operations::fill(ImageData *dest,Color *color)

{
  op_fill fill;
  op_fill local_4;
  
  applyOperation<fe::operations::op_fill>(&local_4,dest);
  return;
}

Assistant:

void fill(ImageData& dest, const Color& color)
        {
            op_fill fill;
            fill.color.r = color.rgba.r;
            fill.color.g = color.rgba.g;
            fill.color.b = color.rgba.b;
            fill.color.a = color.rgba.a;

            applyOperation(fill, dest);
        }